

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

string * __thiscall
t_st_generator::map_writer
          (string *__return_storage_ptr__,t_st_generator *this,t_map *tmap,string *fname)

{
  ostream *poVar1;
  t_type *ptVar2;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  string val;
  undefined1 local_1c0 [8];
  string key;
  ostringstream out;
  string *fname_local;
  t_map *tmap_local;
  t_st_generator *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(key.field_2._M_local_buf + 8));
  temp_name_abi_cxx11_((string *)local_1c0,this);
  temp_name_abi_cxx11_((string *)local_1f0,this);
  poVar1 = std::operator<<((ostream *)((long)&key.field_2 + 8),
                           "[oprot writeMapBegin: (TMap new keyType: ");
  ptVar2 = t_map::get_key_type(tmap);
  type_to_enum_abi_cxx11_(&local_210,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"; valueType: ");
  ptVar2 = t_map::get_val_type(tmap);
  type_to_enum_abi_cxx11_(&local_230,this,ptVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"; size: ");
  poVar1 = std::operator<<(poVar1,(string *)fname);
  poVar1 = std::operator<<(poVar1," size).");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&key.field_2 + 8),(string *)&local_250);
  poVar1 = std::operator<<(poVar1,(string *)fname);
  poVar1 = std::operator<<(poVar1," keysAndValuesDo: [:");
  poVar1 = std::operator<<(poVar1,(string *)local_1c0);
  poVar1 = std::operator<<(poVar1," :");
  poVar1 = std::operator<<(poVar1,(string *)local_1f0);
  poVar1 = std::operator<<(poVar1," |");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_250);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&key.field_2 + 8),(string *)&local_270);
  ptVar2 = t_map::get_key_type(tmap);
  std::__cxx11::string::string((string *)&local_2b0,(string *)local_1c0);
  write_val(&local_290,this,ptVar2,&local_2b0);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2d0,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  ptVar2 = t_map::get_val_type(tmap);
  std::__cxx11::string::string((string *)&local_310,(string *)local_1f0);
  write_val(&local_2f0,this,ptVar2,&local_310);
  std::operator<<(poVar1,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_270);
  t_generator::indent_down((t_generator *)this);
  poVar1 = std::operator<<((ostream *)((long)&key.field_2 + 8),"].");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_330);
  std::operator<<(poVar1,"oprot writeMapEnd] value");
  std::__cxx11::string::~string((string *)&local_330);
  t_generator::indent_down((t_generator *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(key.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::map_writer(t_map* tmap, string fname) {
  std::ostringstream out;
  string key = temp_name();
  string val = temp_name();

  out << "[oprot writeMapBegin: (TMap new keyType: " << type_to_enum(tmap->get_key_type())
      << "; valueType: " << type_to_enum(tmap->get_val_type()) << "; size: " << fname << " size)."
      << endl;
  indent_up();

  out << indent() << fname << " keysAndValuesDo: [:" << key << " :" << val << " |" << endl;
  indent_up();

  out << indent() << write_val(tmap->get_key_type(), key) << "." << endl << indent()
      << write_val(tmap->get_val_type(), val);
  indent_down();

  out << "]." << endl << indent() << "oprot writeMapEnd] value";
  indent_down();

  return out.str();
}